

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O2

pos_type __thiscall
sai::ifstreambuf::seekoff(ifstreambuf *this,off_type Offset,seekdir Direction,openmode param_3)

{
  pos_type pVar1;
  
  if (Direction == _S_end) {
    Offset = Offset + (ulong)this->PageCount * 0x1000;
  }
  else if (Direction == _S_cur) {
    Offset = (Offset + *(long *)&this->field_0x10 + (ulong)this->CurrentPage * 0x1000) -
             *(long *)&this->field_0x18;
  }
  else if (Direction != _S_beg) {
    Offset = 0;
  }
  pVar1 = (pos_type)(**(code **)(*(long *)this + 0x28))(this,Offset,0,8);
  return pVar1;
}

Assistant:

std::streambuf::pos_type ifstreambuf::seekoff(
	std::streambuf::off_type Offset, std::ios::seekdir Direction, std::ios::openmode /*Mode*/
)
{
	std::streambuf::pos_type Position;

	if( Direction == std::ios::beg )
	{
		Position = Offset;
	}
	else if( Direction == std::ios::cur )
	{
		Position = (CurrentPage * VirtualPage::PageSize); // Current Page
		Position += (gptr() - egptr());                   // Offset within page
		Position += Offset;
	}
	else if( Direction == std::ios::end )
	{
		Position = (PageCount * VirtualPage::PageSize) + Offset;
	}

	return seekpos(Position);
}